

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attr.c
# Opt level: O3

int query_pattr(attr_list list,atom_t attr_id,attr_value_type *val_type_p,attr_union *value_p)

{
  double *pdVar1;
  int_attr_struct *piVar2;
  attr_p paVar3;
  void *pvVar4;
  int iVar5;
  ulong uVar6;
  long lVar7;
  
  if (list != (attr_list)0x0) {
    if (list->list_of_lists == 0) {
      piVar2 = (list->l).list.iattrs;
      if ((ulong)piVar2->int_attr_count != 0) {
        uVar6 = 0;
        do {
          if (piVar2->iattr[uVar6].attr_id == attr_id) {
            if (val_type_p != (attr_value_type *)0x0) {
              *val_type_p = Attr_Int4;
            }
            if (value_p != (attr_union *)0x0) {
              (value_p->u).f = (float)((list->l).list.iattrs)->iattr[uVar6].value;
              return 1;
            }
            return 1;
          }
          uVar6 = uVar6 + 1;
        } while (piVar2->int_attr_count != uVar6);
      }
      if (piVar2->other_attr_count == 0) {
        return 0;
      }
      paVar3 = (list->l).list.attributes;
      lVar7 = 0;
      do {
        if (*(int *)((long)&paVar3->attr_id + lVar7) == attr_id) {
          if (val_type_p != (attr_value_type *)0x0) {
            *val_type_p = *(attr_value_type *)((long)&paVar3->val_type + lVar7);
          }
          if (value_p != (attr_union *)0x0) {
            pdVar1 = (double *)((long)&(((list->l).list.attributes)->value).u + lVar7);
            pvVar4 = (void *)pdVar1[1];
            (value_p->u).d = *pdVar1;
            (value_p->u).o.buffer = pvVar4;
            return 1;
          }
          return 1;
        }
        lVar7 = lVar7 + 0x18;
      } while ((ulong)piVar2->other_attr_count * 0x18 != lVar7);
    }
    else {
      if ((list->l).lists.sublist_count < 1) {
        return 0;
      }
      lVar7 = 0;
      do {
        iVar5 = query_pattr((list->l).lists.lists[lVar7],attr_id,val_type_p,value_p);
        if (iVar5 != 0) {
          return 1;
        }
        lVar7 = lVar7 + 1;
      } while (lVar7 < (list->l).lists.sublist_count);
    }
  }
  return 0;
}

Assistant:

extern int
query_pattr(attr_list list, atom_t attr_id, attr_value_type *val_type_p, attr_union *value_p)
{
    if (list == NULL) return 0;
    if (list->list_of_lists) {
        int i;
        for (i=0; i< list->l.lists.sublist_count; i++) {
            if (query_pattr(list->l.lists.lists[i], attr_id, val_type_p,
                           value_p)) {
                return 1;
            }
        }
        return 0;
    } else {
	int index = 0;
	while(index < list->l.list.iattrs->int_attr_count) {
	    if (list->l.list.iattrs->iattr[index].attr_id == attr_id) {
		if (val_type_p != NULL) {
		    *val_type_p = Attr_Int4;
		}
		if (value_p != NULL) {
		    if (sizeof(long) != 4){
			value_p->u.i = (int)(long)list->l.list.iattrs->iattr[index].value;
		    } else {
			value_p->u.l = list->l.list.iattrs->iattr[index].value;
		    }
		}
		return 1;
	    }
	    index++;
        }
	index = 0;
	while(index < list->l.list.iattrs->other_attr_count) {
	    if (list->l.list.attributes[index].attr_id == attr_id) {
		if (val_type_p != NULL) {
		    *val_type_p = list->l.list.attributes[index].val_type;
		}
		if (value_p != NULL) {
		    *value_p = list->l.list.attributes[index].value;
		}
		return 1;
	    }
	    index++;
        }
        return 0;
    }
}